

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O1

int pt_evt_sync_backward(pt_event_decoder *decoder)

{
  uint8_t *puVar1;
  int iVar2;
  pt_config *config;
  uint8_t *puVar3;
  uint8_t *puVar4;
  
  if (decoder == (pt_event_decoder *)0x0) {
    return -2;
  }
  puVar4 = (decoder->pacdec).pos;
  puVar3 = puVar4;
  if ((puVar4 == (uint8_t *)0x0) &&
     (puVar4 = (decoder->pacdec).config.end, puVar3 = puVar4, puVar4 == (uint8_t *)0x0)) {
    iVar2 = -10;
  }
  else {
    do {
      pt_evt_reset(decoder);
      do {
        iVar2 = pt_pkt_sync_backward(&decoder->pacdec);
        if (iVar2 < 0) {
          return iVar2;
        }
        puVar1 = (decoder->pacdec).pos;
      } while (puVar4 <= puVar1);
      iVar2 = pt_evt_start(decoder);
      puVar4 = puVar1;
    } while (puVar3 <= (decoder->pacdec).pos);
  }
  return iVar2;
}

Assistant:

int pt_evt_sync_backward(struct pt_event_decoder *decoder)
{
	const uint8_t *start, *sync, *pos;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	start = pt_evt_pos(decoder);
	if (!start) {
		start = pt_evt_end(decoder);
		if (!start)
			return -pte_bad_config;
	}

	sync = start;
	for (;;) {
		errcode = pt_evt_reset(decoder);
		if (errcode < 0)
			return errcode;

		do {
			errcode = pt_pkt_sync_backward(&decoder->pacdec);
			if (errcode < 0)
				return errcode;

			pos = pt_evt_pos(decoder);
		} while (sync <= pos);

		sync = pos;

		errcode = pt_evt_start(decoder);

		pos = pt_evt_pos(decoder);
		if (pos < start)
			return errcode;
	}
}